

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

int src_set_ratio(SRC_STATE *state,double new_ratio)

{
  int iVar1;
  double new_ratio_local;
  SRC_STATE *state_local;
  
  if (state == (SRC_STATE *)0x0) {
    state_local._4_4_ = 2;
  }
  else {
    iVar1 = is_bad_src_ratio(new_ratio);
    if (iVar1 == 0) {
      state->last_ratio = new_ratio;
      state_local._4_4_ = 0;
    }
    else {
      state_local._4_4_ = 6;
    }
  }
  return state_local._4_4_;
}

Assistant:

int
src_set_ratio (SRC_STATE *state, double new_ratio)
{
	if (state == NULL)
		return SRC_ERR_BAD_STATE ;

	if (is_bad_src_ratio (new_ratio))
		return SRC_ERR_BAD_SRC_RATIO ;

	state->last_ratio = new_ratio ;

	return SRC_ERR_NO_ERROR ;
}